

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Impl::makeDep
          (Impl *this,Binding *result,uint64_t typeId,Which whichType,Which expectedKind,
          Reader brand,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  Reader RVar1;
  RawSchema *schema_00;
  RawBrandedSchema *pRVar2;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_c0;
  SegmentReader *local_a8;
  CapTableReader *pCStack_a0;
  void *local_98;
  WirePointer *pWStack_90;
  undefined8 local_88;
  int iStack_80;
  undefined4 uStack_7c;
  String local_60;
  ArrayPtr<const_char> local_48;
  RawSchema *local_38;
  RawSchema *schema;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings_local;
  Which expectedKind_local;
  uint64_t uStack_20;
  Which whichType_local;
  uint64_t typeId_local;
  Binding *result_local;
  Impl *this_local;
  
  RVar1._reader = brand._reader;
  schema = (RawSchema *)brandBindings;
  brandBindings_local._4_2_ = expectedKind;
  brandBindings_local._6_2_ = whichType;
  uStack_20 = typeId;
  typeId_local = (uint64_t)result;
  result_local = (Binding *)this;
  kj::str<char_const(&)[38],kj::StringPtr&,char_const(&)[2]>
            (&local_60,(kj *)"(unknown type; seen as dependency of ",(char (*) [38])&scopeName,
             (StringPtr *)0x28e38c,(char (*) [2])this);
  kj::StringPtr::StringPtr((StringPtr *)&local_48,&local_60);
  schema_00 = loadEmpty(this,typeId,(StringPtr)local_48,brandBindings_local._4_2_,true);
  kj::String::~String(&local_60);
  *(undefined1 *)typeId_local = brandBindings_local._6_1_;
  local_a8 = brand._reader.segment;
  pCStack_a0 = brand._reader.capTable;
  local_98 = brand._reader.data;
  pWStack_90 = brand._reader.pointers;
  local_88._0_4_ = brand._reader.dataSize;
  local_88._4_2_ = brand._reader.pointerCount;
  local_88._6_2_ = brand._reader._38_2_;
  brand._reader._40_8_ = RVar1._reader._40_8_;
  iStack_80 = brand._reader.nestingLimit;
  uStack_7c = brand._reader._44_4_;
  local_38 = schema_00;
  kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe(&local_c0,brandBindings);
  RVar1._reader.capTable = pCStack_a0;
  RVar1._reader.segment = local_a8;
  RVar1._reader.data = local_98;
  RVar1._reader.pointers = pWStack_90;
  RVar1._reader.dataSize = (StructDataBitCount)local_88;
  RVar1._reader.pointerCount = local_88._4_2_;
  RVar1._reader._38_2_ = local_88._6_2_;
  RVar1._reader.nestingLimit = iStack_80;
  RVar1._reader._44_4_ = uStack_7c;
  pRVar2 = makeBranded(this,schema_00,RVar1,&local_c0);
  *(RawBrandedSchema **)(typeId_local + 8) = pRVar2;
  kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_c0);
  return;
}

Assistant:

void SchemaLoader::Impl::makeDep(_::RawBrandedSchema::Binding& result,
    uint64_t typeId, schema::Type::Which whichType, schema::Node::Which expectedKind,
    schema::Brand::Reader brand, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  const _::RawSchema* schema = loadEmpty(typeId,
      kj::str("(unknown type; seen as dependency of ", scopeName, ")"),
      expectedKind, true);
  result.which = static_cast<uint8_t>(whichType);
  result.schema = makeBranded(schema, brand, brandBindings);
}